

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var __thiscall
Js::GlobalObject::ExecuteEvalParsedFunction
          (GlobalObject *this,ScriptFunction *pfuncScript,FrameDisplay *environment,Var *varThis,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  ThreadContext *pTVar5;
  JavascriptMethod p_Var6;
  CallInfo local_64;
  CallInfo local_5c [2];
  undefined1 local_48 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var varResult;
  ScriptContext *scriptContext_local;
  Var *varThis_local;
  FrameDisplay *environment_local;
  ScriptFunction *pfuncScript_local;
  GlobalObject *this_local;
  
  if (pfuncScript == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x2c5,"(pfuncScript != nullptr)","pfuncScript != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ScriptFunction::SetEnvironment(pfuncScript,environment);
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x2c9,"(pfuncScript->GetFunctionBody())",
                                "pfuncScript->GetFunctionBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
  bVar2 = FunctionBody::GetFuncEscapes(pFVar4);
  if (bVar2) {
    ScriptFunction::InvalidateCachedScopeChain(pfuncScript);
  }
  autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
  autoReentrancyHandler._9_7_ = 0;
  pTVar5 = ScriptContext::GetThreadContext(scriptContext);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_48,pTVar5);
  pTVar5 = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar5);
  pTVar5 = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::AssertJsReentrancy(pTVar5);
  p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)pfuncScript);
  CheckIsExecutable((RecyclableObject *)pfuncScript,p_Var6);
  p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)pfuncScript);
  CallInfo::CallInfo(local_5c,CallFlags_Eval,1);
  CallInfo::CallInfo(&local_64,CallFlags_Eval,1);
  autoReentrancyHandler._8_8_ =
       (*p_Var6)((RecyclableObject *)pfuncScript,(CallInfo)pfuncScript,local_5c[0],0,0,0,0,local_64,
                 *varThis);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_48);
  ScriptFunction::SetEnvironment(pfuncScript,(FrameDisplay *)&NullFrameDisplay);
  return (Var)autoReentrancyHandler._8_8_;
}

Assistant:

Var GlobalObject::ExecuteEvalParsedFunction(ScriptFunction *pfuncScript, FrameDisplay* environment, Var &varThis, ScriptContext *scriptContext)
    {
        Assert(pfuncScript != nullptr);

        pfuncScript->SetEnvironment(environment);
        //This function is supposed to be deserialized
        Assert(pfuncScript->GetFunctionBody());
        if (pfuncScript->GetFunctionBody()->GetFuncEscapes())
        {
            // Executing the eval causes the scope chain to escape.
            pfuncScript->InvalidateCachedScopeChain();
        }
        Var varResult = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            varResult = CALL_FUNCTION(scriptContext->GetThreadContext(), pfuncScript, CallInfo(CallFlags_Eval, 1), varThis);
        }
        END_SAFE_REENTRANT_CALL
        pfuncScript->SetEnvironment((FrameDisplay*)&NullFrameDisplay);
        return varResult;
    }